

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collectives.hpp
# Opt level: O0

void diy::mpi::Collectives<char,_void_*>::gather
               (communicator *comm,vector<char,_std::allocator<char>_> *in,int root)

{
  undefined8 in_RDI;
  int root_00;
  int *in_stack_00000008;
  void *in_stack_00000010;
  datatype *in_stack_00000018;
  int in_stack_00000024;
  void *in_stack_00000028;
  communicator *in_stack_00000030;
  undefined4 in_stack_00000040;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  int *in_stack_ffffffffffffffc8;
  communicator *in_stack_ffffffffffffffd0;
  
  root_00 = (int)((ulong)in_RDI >> 0x20);
  count<std::vector<char,std::allocator<char>>>((vector<char,_std::allocator<char>_> *)0x17c9b6);
  Collectives<int,_void_*>::gather(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,root_00);
  address<std::vector<char,std::allocator<char>>>((vector<char,_std::allocator<char>_> *)0x17c9e1);
  count<std::vector<char,std::allocator<char>>>((vector<char,_std::allocator<char>_> *)0x17c9f0);
  datatype_of<std::vector<char,std::allocator<char>>>(in_stack_ffffffffffffffa8);
  detail::gather_v(in_stack_00000030,in_stack_00000028,in_stack_00000024,in_stack_00000018,
                   in_stack_00000010,in_stack_00000008,(int *)CONCAT44(root,in_stack_00000040),
                   (int)in);
  return;
}

Assistant:

static void gather(const communicator& comm, const std::vector<T>& in, int root)
    {
      Collectives<int,void*>::gather(comm, count(in), root);
      detail::gather_v(comm, address(in), count(in), datatype_of(in), 0, 0, 0, root);
    }